

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRet.c
# Opt level: O2

void Rtm_ManFree(Rtm_Man_t *p)

{
  Vec_PtrFree(p->vObjs);
  Vec_PtrFree(p->vPis);
  Vec_PtrFree(p->vPos);
  Aig_MmFlexStop(p->pMem,0);
  free(p->pExtra);
  free(p);
  return;
}

Assistant:

void Rtm_ManFree( Rtm_Man_t * p )
{
    Vec_PtrFree( p->vObjs );
    Vec_PtrFree( p->vPis );
    Vec_PtrFree( p->vPos );
    Aig_MmFlexStop( p->pMem, 0 );
    ABC_FREE( p->pExtra );
    ABC_FREE( p );
}